

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int get_exts(void)

{
  GLuint GVar1;
  GLubyte *pGVar2;
  int index;
  
  if (max_loaded_major < 3) {
    exts = (char *)(*glad_glGetString)(0x1f03);
  }
  else {
    num_exts_i = 0;
    (*glad_glGetIntegerv)(0x821d,&num_exts_i);
    if (0 < num_exts_i) {
      exts_i = (char **)realloc(exts_i,(long)num_exts_i << 3);
    }
    if (exts_i == (char **)0x0) {
      return 0;
    }
    for (GVar1 = 0; (int)GVar1 < num_exts_i; GVar1 = GVar1 + 1) {
      pGVar2 = (*glad_glGetStringi)(0x1f03,GVar1);
      exts_i[(int)GVar1] = (char *)pGVar2;
    }
  }
  return 1;
}

Assistant:

static int get_exts(void) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(max_loaded_major < 3) {
#endif
        exts = (const char *)glGetString(GL_EXTENSIONS);
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;

        num_exts_i = 0;
        glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts_i);
        if (num_exts_i > 0) {
            exts_i = (const char **)realloc((void *)exts_i, num_exts_i * sizeof *exts_i);
        }

        if (exts_i == NULL) {
            return 0;
        }

        for(index = 0; index < num_exts_i; index++) {
            exts_i[index] = (const char*)glGetStringi(GL_EXTENSIONS, index);
        }
    }
#endif
    return 1;
}